

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

Result * __thiscall
doctest::detail::Expression_lhs::operator_cast_to_Result
          (Result *__return_storage_ptr__,Expression_lhs *this)

{
  Expression_lhs EVar1;
  Expression_lhs EVar2;
  char *__dest;
  char *pcVar3;
  anon_union_24_2_13149d16_for_String_2 local_40;
  
  EVar1 = *this;
  EVar2 = this[5];
  if (((((byte)EVar2 ^ (byte)EVar1) & 1) == 0) || (*(char *)(g_cs + 0x6c) == '\x01')) {
    pcVar3 = "a.isDefined() == false";
    if (EVar1 != (Expression_lhs)0x0) {
      pcVar3 = "a.isDefined() == true";
    }
    __dest = String::allocate((String *)&local_40.data,(uint)((ulong)(byte)EVar1 ^ 5));
    memcpy(__dest,pcVar3 + 0x11,(ulong)(byte)EVar1 ^ 5);
    __return_storage_ptr__->m_passed = (bool)(((byte)EVar2 ^ (byte)EVar1) & 1);
    if (local_40.buf[0x17] < '\0') {
      pcVar3 = String::allocate(&__return_storage_ptr__->m_decomp,local_40.data.size);
      memcpy(pcVar3,local_40.data.ptr,(ulong)local_40.data.size);
    }
    else {
      *(ulong *)((long)&(__return_storage_ptr__->m_decomp).field_0 + 0x10) =
           CONCAT17(local_40.buf[0x17],local_40._16_7_);
      (__return_storage_ptr__->m_decomp).field_0.data.ptr = local_40.data.ptr;
      *(ulong *)((long)&(__return_storage_ptr__->m_decomp).field_0 + 8) =
           CONCAT44(local_40.data.capacity,local_40.data.size);
    }
    if ((local_40.buf[0x17] < '\0') && (local_40.data.ptr != (char *)0x0)) {
      operator_delete__(local_40.data.ptr);
    }
  }
  else {
    __return_storage_ptr__->m_passed = true;
    (__return_storage_ptr__->m_decomp).field_0.data.ptr = (char *)0x0;
    (__return_storage_ptr__->m_decomp).field_0.buf[0x17] = '\x17';
  }
  return __return_storage_ptr__;
}

Assistant:

DOCTEST_NOINLINE operator Result() {
// this is needed only for MSVC 2015
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4800) // 'int': forcing value to bool
            bool res = static_cast<bool>(lhs);
DOCTEST_MSVC_SUPPRESS_WARNING_POP
            if(m_at & assertType::is_false) //!OCLINT bitwise operator in conditional
                res = !res;

            if(!res || getContextOptions()->success)
                return Result(res, toString(lhs));
            return Result(res);
        }